

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RtreeNode * rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur,int *pRC)

{
  RtreeSearchPoint *pRVar1;
  int iVar2;
  RtreeNode **ppNode;
  
  ppNode = (RtreeNode **)((long)pCur + (1 - (ulong)pCur->bPoint) * 8 + 0x58);
  if (*ppNode == (RtreeNode *)0x0) {
    if (pCur->bPoint == 1) {
      pRVar1 = &pCur->sPoint;
    }
    else {
      pRVar1 = pCur->aPoint;
    }
    iVar2 = nodeAcquire((Rtree *)(pCur->base).pVtab,pRVar1->id,(RtreeNode *)0x0,ppNode);
    *pRC = iVar2;
  }
  return *ppNode;
}

Assistant:

static RtreeNode *rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur, int *pRC){
  sqlite3_int64 id;
  int ii = 1 - pCur->bPoint;
  assert( ii==0 || ii==1 );
  assert( pCur->bPoint || pCur->nPoint );
  if( pCur->aNode[ii]==0 ){
    assert( pRC!=0 );
    id = ii ? pCur->aPoint[0].id : pCur->sPoint.id;
    *pRC = nodeAcquire(RTREE_OF_CURSOR(pCur), id, 0, &pCur->aNode[ii]);
  }
  return pCur->aNode[ii];
}